

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O1

char * nni_strcasestr(char *s1,char *s2)

{
  char cVar1;
  __int32_t **pp_Var2;
  long lVar3;
  char cVar4;
  char *pcVar5;
  
  cVar4 = *s1;
  do {
    if (cVar4 == '\0') {
      return (char *)0x0;
    }
    cVar4 = *s1;
    pcVar5 = s2;
    if (cVar4 != '\0') {
      lVar3 = 0;
      do {
        cVar1 = s2[lVar3];
        if ((long)cVar1 == 0) goto LAB_00118312;
        pp_Var2 = __ctype_tolower_loc();
        if ((*pp_Var2)[cVar4] != (*pp_Var2)[cVar1]) break;
        pcVar5 = pcVar5 + 1;
        cVar4 = s1[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (cVar4 != '\0');
      pcVar5 = s2 + lVar3;
    }
LAB_00118312:
    if (*pcVar5 == '\0') {
      return s1;
    }
    cVar4 = s1[1];
    s1 = s1 + 1;
  } while( true );
}

Assistant:

char *
nni_strcasestr(const char *s1, const char *s2)
{
#ifdef NNG_HAVE_STRCASESTR
	return (strcasestr(s1, s2));
#else
	const char *t1, *t2;
	while (*s1) {
		for (t1 = s1, t2 = s2; *t1 && *t2; t2++, t1++) {
			if (tolower(*t1) != tolower(*t2)) {
				break;
			}
		}
		if (*t2 == 0) {
			return ((char *) s1);
		}
		s1++;
	}
	return (NULL);
#endif
}